

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ans_smsb.hpp
# Opt level: O0

size_t ans_smsb_compress<40u>(uint8_t *dst,size_t dstCapacity,uint32_t *src,size_t srcSize)

{
  reference pvVar1;
  size_t sVar2;
  uint8_t **in_RCX;
  size_t in_RSI;
  uint32_t *in_RDI;
  uint32_t i_1;
  size_t cur_sym;
  uint32_t i;
  array<unsigned_long,_4UL> states;
  uint8_t *out_u8;
  ans_smsb_encode<40U> ans_frame;
  uint32_t *in_u32;
  uint32_t num_states;
  uint8_t **in_stack_ffffffffffffff28;
  ans_smsb_encode<40U> *in_stack_ffffffffffffff30;
  uint local_bc;
  uint8_t **out_u8_00;
  uint sym;
  uint64_t *in_stack_ffffffffffffff58;
  ans_smsb_encode<40U> *in_stack_ffffffffffffff60;
  uint32_t *local_78;
  ans_smsb_encode<40U> local_70;
  undefined4 local_24;
  uint8_t **local_20;
  uint32_t *puVar3;
  
  local_24 = 4;
  local_20 = in_RCX;
  local_78 = in_RDI;
  ans_smsb_encode<40U>::create(in_RDI,in_RSI);
  puVar3 = local_78;
  ans_smsb_encode<40U>::serialize(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  for (sym = 0; sym < 4; sym = sym + 1) {
    in_stack_ffffffffffffff30 =
         (ans_smsb_encode<40U> *)ans_smsb_encode<40U>::initial_state(&local_70);
    pvVar1 = std::array<unsigned_long,_4UL>::operator[]
                       ((array<unsigned_long,_4UL> *)in_stack_ffffffffffffff30,
                        (size_type)in_stack_ffffffffffffff28);
    *pvVar1 = (value_type_conflict2)in_stack_ffffffffffffff30;
  }
  for (out_u8_00 = (uint8_t **)0x0; ((long)local_20 - (long)out_u8_00 & 3U) != 0;
      out_u8_00 = (uint8_t **)((long)out_u8_00 + 1)) {
    std::array<unsigned_long,_4UL>::operator[]
              ((array<unsigned_long,_4UL> *)in_stack_ffffffffffffff30,
               (size_type)in_stack_ffffffffffffff28);
    ans_smsb_encode<40U>::encode_symbol
              (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,sym,out_u8_00);
  }
  for (; out_u8_00 != local_20; out_u8_00 = (uint8_t **)((long)out_u8_00 + 4)) {
    std::array<unsigned_long,_4UL>::operator[]
              ((array<unsigned_long,_4UL> *)in_stack_ffffffffffffff30,
               (size_type)in_stack_ffffffffffffff28);
    ans_smsb_encode<40U>::encode_symbol
              (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,sym,out_u8_00);
    std::array<unsigned_long,_4UL>::operator[]
              ((array<unsigned_long,_4UL> *)in_stack_ffffffffffffff30,
               (size_type)in_stack_ffffffffffffff28);
    ans_smsb_encode<40U>::encode_symbol
              (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,sym,out_u8_00);
    std::array<unsigned_long,_4UL>::operator[]
              ((array<unsigned_long,_4UL> *)in_stack_ffffffffffffff30,
               (size_type)in_stack_ffffffffffffff28);
    ans_smsb_encode<40U>::encode_symbol
              (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,sym,out_u8_00);
    std::array<unsigned_long,_4UL>::operator[]
              ((array<unsigned_long,_4UL> *)in_stack_ffffffffffffff30,
               (size_type)in_stack_ffffffffffffff28);
    ans_smsb_encode<40U>::encode_symbol
              (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,sym,out_u8_00);
  }
  for (local_bc = 0; local_bc < 4; local_bc = local_bc + 1) {
    pvVar1 = std::array<unsigned_long,_4UL>::operator[]
                       ((array<unsigned_long,_4UL> *)in_stack_ffffffffffffff30,
                        (size_type)in_stack_ffffffffffffff28);
    ans_smsb_encode<40U>::flush_state(&local_70,*pvVar1,(uint8_t **)&local_78);
  }
  sVar2 = (long)local_78 - (long)puVar3;
  ans_smsb_encode<40U>::~ans_smsb_encode(in_stack_ffffffffffffff30);
  return sVar2;
}

Assistant:

size_t ans_smsb_compress(
    uint8_t* dst, size_t dstCapacity, const uint32_t* src, size_t srcSize)
{
    const uint32_t num_states = 4;
#ifdef RECORD_STATS
    auto start_compress = std::chrono::high_resolution_clock::now();
#endif

    auto in_u32 = reinterpret_cast<const uint32_t*>(src);
    auto ans_frame = ans_smsb_encode<H_approx>::create(in_u32, srcSize);
    uint8_t* out_u8 = reinterpret_cast<uint8_t*>(dst);

    // serialize model
    ans_frame.serialize(out_u8);

    std::array<uint64_t, num_states> states;

    // start encoding
    for (uint32_t i = 0; i < num_states; i++)
        states[i] = ans_frame.initial_state();

#ifdef RECORD_STATS
    auto stop_prelude = std::chrono::high_resolution_clock::now();
    get_stats().prelude_bytes = out_u8 - reinterpret_cast<uint8_t*>(dst);
    get_stats().prelude_time_ns = (stop_prelude - start_compress).count();
#endif

    size_t cur_sym = 0;
    while ((srcSize - cur_sym) % num_states != 0) {
        ans_frame.encode_symbol(
            states[0], in_u32[srcSize - cur_sym - 1], out_u8);
        cur_sym += 1;
    }
    while (cur_sym != srcSize) {
        ans_frame.encode_symbol(
            states[0], in_u32[srcSize - cur_sym - 1], out_u8);
        ans_frame.encode_symbol(
            states[1], in_u32[srcSize - cur_sym - 2], out_u8);
        ans_frame.encode_symbol(
            states[2], in_u32[srcSize - cur_sym - 3], out_u8);
        ans_frame.encode_symbol(
            states[3], in_u32[srcSize - cur_sym - 4], out_u8);
        cur_sym += num_states;
    }

    // flush final state
    for (uint32_t i = 0; i < num_states; i++)
        ans_frame.flush_state(states[i], out_u8);

#ifdef RECORD_STATS
    auto stop_compress = std::chrono::high_resolution_clock::now();
    get_stats().encode_bytes = (out_u8 - reinterpret_cast<uint8_t*>(dst))
        - get_stats().prelude_bytes;
    get_stats().encode_time_ns = (stop_compress - stop_prelude).count();
#endif

    return out_u8 - reinterpret_cast<uint8_t*>(dst);
}